

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::verifyLookupTextureData
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  undefined1 *puVar1;
  pointer pcVar2;
  Functions *pFVar3;
  pointer __s;
  pointer puVar4;
  GLenum GVar5;
  GLint GVar6;
  ostream *poVar7;
  size_t sVar8;
  TestError *this_00;
  int iVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  size_type __new_size;
  GLint depth;
  GLuint verifyTexture;
  GLint height;
  GLint width;
  GLenum local_754;
  int local_750;
  allocator<char> local_74a;
  allocator<char> local_749;
  Functions *local_748;
  SparseTexture2LookupTestCase *local_740;
  GLint local_738;
  GLint local_734;
  ulong local_730;
  GLuint fbo;
  ostream *local_720;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  string local_6f8;
  string local_6d8;
  string fragment;
  string vertex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  value_type local_648;
  string functionDef;
  FunctionToken f;
  ShaderProgram program;
  ProgramSources sources;
  TokenStringsExt s;
  
  puVar1 = &(this->super_SparseTextureClampLookupResidencyTestCase).
            super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
            super_SparseTextureCommitmentTestCase.field_0x88;
  local_748 = gl;
  local_738 = format;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"Verify Lookup Color Texture Data [function: ",0x2c);
  local_720 = (ostream *)puVar1;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(funcToken->name)._M_dataplus._M_p,
                      (funcToken->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", level: ",9);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] - ",4);
  if ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.levels +
      -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
               ,0x30a);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTextureClampLookupResidencyTestCase).
                     super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  bVar14 = true;
  if ((height != 0 && width != 0) &&
     ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.minDepth
      <= depth)) {
    if (target == 0x8513) {
      depth = depth * 6;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = (size_type)(height * width);
    local_740 = (SparseTexture2LookupTestCase *)this;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar4 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,__new_size);
    f.name._M_dataplus._M_p = (pointer)&f.name.field_2;
    pcVar2 = (funcToken->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f,pcVar2,pcVar2 + (funcToken->name)._M_string_length);
    f.arguments._M_dataplus._M_p = (pointer)&f.arguments.field_2;
    pcVar2 = (funcToken->arguments)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f.arguments,pcVar2,pcVar2 + (funcToken->arguments)._M_string_length);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&f.allowedTargets._M_t,&(funcToken->allowedTargets)._M_t);
    pFVar3 = local_748;
    gl4cts::Texture::Generate(local_748,&verifyTexture);
    gl4cts::Texture::Bind(pFVar3,verifyTexture,0xde1);
    gl4cts::Texture::Storage(pFVar3,0xde1,1,0x8229,width,height,depth);
    GVar5 = (*pFVar3->getError)();
    glu::checkError(GVar5,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x32e);
    (*pFVar3->genFramebuffers)(1,&fbo);
    GVar5 = (*pFVar3->getError)();
    glu::checkError(GVar5,"glGenFramebuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x332);
    (*pFVar3->bindFramebuffer)(0x8d40,fbo);
    GVar5 = (*pFVar3->getError)();
    glu::checkError(GVar5,"glBindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x334);
    (*pFVar3->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,verifyTexture,0);
    GVar5 = (*pFVar3->getError)();
    glu::checkError(GVar5,"glFramebufferTexture2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x336);
    (*pFVar3->viewport)(0,0,width,height);
    if (depth < 1) {
      bVar14 = true;
    }
    else {
      iVar9 = (((SparseTextureClampLookupResidencyTestCase *)
               &local_740->super_SparseTexture2CommitmentTestCase)->
              super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mState.samples;
      bVar14 = true;
      local_730 = 0;
      GVar6 = depth;
      local_754 = target;
      local_734 = level;
      do {
        if (0 < iVar9) {
          local_750 = 0;
          do {
            memset(__s,0,__new_size);
            gl4cts::Texture::Bind(local_748,verifyTexture,0xde1);
            gl4cts::Texture::SubImage(local_748,0xde1,0,0,0,0,width,height,0,0x1903,0x1401,__s);
            GVar5 = (*local_748->getError)();
            glu::checkError(GVar5,"Texture::SubImage",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x343);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertex,stc_vertex_common,(allocator<char> *)&s);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragment,stc_fragment_lookupColor,(allocator<char> *)&s);
            local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
            _Var11 = f.name._M_dataplus;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_6d8,f.name._M_dataplus._M_p,
                       f.name._M_dataplus._M_p + f.name._M_string_length);
            generateFunctionDef(&functionDef,(SparseTextureClampLookupColorTestCase *)_Var11._M_p,
                                &local_6d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
              operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1
                             );
            }
            SparseTexture2LookupTestCase::createLookupShaderTokens
                      (&s,local_740,local_754,local_738,local_734,local_750,&f);
            local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
            _Var11 = s.super_TokenStrings.returnType._M_dataplus;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_6f8,s.super_TokenStrings.returnType._M_dataplus._M_p,
                       s.super_TokenStrings.returnType._M_dataplus._M_p +
                       s.super_TokenStrings.returnType._M_string_length);
            generateExpectedResult
                      ((string *)&sources,(SparseTextureClampLookupColorTestCase *)_Var11._M_p,
                       &local_6f8,local_734);
            std::__cxx11::string::operator=
                      ((string *)&s.super_TokenStrings.resultExpected,(string *)&sources);
            if (sources.sources[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&sources.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(sources.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&((sources.sources[0].
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             _M_dataplus)._M_p + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
              operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1
                             );
            }
            replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&vertex);
            replaceToken("<FUNCTION_DEF>",functionDef._M_dataplus._M_p,&fragment);
            replaceToken("<FUNCTION>",f.name._M_dataplus._M_p,&fragment);
            replaceToken("<ARGUMENTS>",f.arguments._M_dataplus._M_p,&fragment);
            replaceToken("<OUTPUT_TYPE>",s.super_TokenStrings.outputType._M_dataplus._M_p,&fragment)
            ;
            replaceToken("<INPUT_TYPE>",s.super_TokenStrings.inputType._M_dataplus._M_p,&fragment);
            replaceToken("<SIZE_DEF>",s.sizeDef._M_dataplus._M_p,&fragment);
            replaceToken("<LOD>",s.lod._M_dataplus._M_p,&fragment);
            replaceToken("<LOD_DEF>",s.lodDef._M_dataplus._M_p,&fragment);
            replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&fragment);
            replaceToken("<ICOORD_TYPE>",s.coordType._M_dataplus._M_p,&fragment);
            replaceToken("<COORD_DEF>",s.coordDef._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_TYPE>",s.super_TokenStrings.pointType._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_DEF>",s.super_TokenStrings.pointDef._M_dataplus._M_p,&fragment);
            replaceToken("<RETURN_TYPE>",s.super_TokenStrings.returnType._M_dataplus._M_p,&fragment)
            ;
            replaceToken("<RESULT_EXPECTED>",s.super_TokenStrings.resultExpected._M_dataplus._M_p,
                         &fragment);
            replaceToken("<EPSILON>",s.super_TokenStrings.epsilon._M_dataplus._M_p,&fragment);
            replaceToken("<SAMPLE_DEF>",s.super_TokenStrings.sampleDef._M_dataplus._M_p,&fragment);
            replaceToken("<REFZ_DEF>",s.refZDef._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_COORD>",s.pointCoord._M_dataplus._M_p,&fragment);
            replaceToken("<COMPONENT_DEF>",s.componentDef._M_dataplus._M_p,&fragment);
            replaceToken("<CUBE_MAP_COORD_DEF>",s.cubeMapCoordDef._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_ARRAY_DEF>",s.offsetArrayDef._M_dataplus._M_p,&fragment);
            replaceToken("<FORMAT_DEF>",s.formatDef._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_TYPE>",s.offsetType._M_dataplus._M_p,&fragment);
            replaceToken("<NOFFSET_TYPE>",s.nOffsetType._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_DIM>",s.offsetDim._M_dataplus._M_p,&fragment);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,width);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_WIDTH>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,height);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_HEIGHT>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,depth);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_DEPTH>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&program,vertex._M_dataplus._M_p,&local_749);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_648,fragment._M_dataplus._M_p,&local_74a);
            memset(&sources,0,0xac);
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            sources._193_8_ = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(sources.sources,(value_type *)&program);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(sources.sources + 1,&local_648);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_648._M_dataplus._M_p != &local_648.field_2) {
              operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1
                             );
            }
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            glu::ShaderProgram::ShaderProgram
                      (&program,((((SparseTextureClampLookupResidencyTestCase *)
                                  &local_740->super_SparseTexture2CommitmentTestCase)->
                                 super_SparseTexture2LookupTestCase).
                                 super_SparseTexture2CommitmentTestCase.
                                 super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                                m_renderCtx,&sources);
            pFVar3 = local_748;
            if (program.m_program.m_info.linkOk == true) {
              (*local_748->useProgram)(program.m_program.m_program);
              GVar5 = (*pFVar3->getError)();
              glu::checkError(GVar5,"glUseProgram",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x379);
              (*pFVar3->activeTexture)(0x84c0);
              GVar5 = (*pFVar3->getError)();
              glu::checkError(GVar5,"glActiveTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x37d);
              (*pFVar3->uniform1i)(1,0);
              GVar5 = (*pFVar3->getError)();
              glu::checkError(GVar5,"glUniform1i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x37f);
              (*pFVar3->bindTexture)(local_754,*texture);
              GVar5 = (*pFVar3->getError)();
              glu::checkError(GVar5,"glBindTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x382);
              (*pFVar3->clear)(0x4100);
              (**(code **)(*(long *)&(((SparseTextureClampLookupResidencyTestCase *)
                                      &local_740->super_SparseTexture2CommitmentTestCase)->
                                     super_SparseTexture2LookupTestCase).
                                     super_SparseTexture2CommitmentTestCase.
                                     super_SparseTextureCommitmentTestCase.super_TestCase.
                                     super_TestCase.super_TestNode + 0xa0))
                        (local_740,local_754,local_730,&program);
              gl4cts::Texture::Bind(pFVar3,verifyTexture,0xde1);
              gl4cts::Texture::GetData(pFVar3,0,0xde1,0x1903,0x1401,__s);
              GVar5 = (*pFVar3->getError)();
              glu::checkError(GVar5,"Texture::GetData",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x389);
              if (0 < (long)height) {
                iVar9 = 0;
                lVar12 = 0;
                do {
                  if (0 < width) {
                    uVar13 = 0;
                    do {
                      bVar14 = (bool)(bVar14 & puVar4[uVar13 + (long)iVar9] ==
                                               __s[uVar13 + (long)iVar9]);
                      uVar13 = uVar13 + 1;
                    } while ((uint)width != uVar13);
                  }
                  lVar12 = lVar12 + 1;
                  iVar9 = iVar9 + width;
                } while (lVar12 != height);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_720,"Shader compilation failed (lookup color) for target: ",0x35);
              poVar7 = (ostream *)std::ostream::operator<<(local_720,local_754);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", format: ",10);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_738);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", vertexInfoLog: ",0x11);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,((*program.m_shaders[0].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog._M_dataplus._M_p,
                                  ((*program.m_shaders[0].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                  _M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", fragmentInfoLog: ",0x13);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,((*program.m_shaders[1].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog._M_dataplus._M_p,
                                  ((*program.m_shaders[1].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                  _M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", programInfoLog: ",0x12);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,program.m_program.m_info.infoLog._M_dataplus._M_p,
                                  program.m_program.m_info.infoLog._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", fragmentSource: ",0x12);
              _Var11 = fragment._M_dataplus;
              if (fragment._M_dataplus._M_p == (pointer)0x0) {
                std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
              }
              else {
                sVar8 = strlen(fragment._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,_Var11._M_p,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
              bVar14 = false;
            }
            glu::ShaderProgram::~ShaderProgram(&program);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&sources.transformFeedbackVaryings);
            std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
            ~vector(&sources.attribLocationBindings);
            lVar12 = 0x78;
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&sources.sources[0].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar12));
              lVar12 = lVar12 + -0x18;
            } while (lVar12 != -0x18);
            SparseTexture2LookupTestCase::TokenStringsExt::~TokenStringsExt(&s);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)functionDef._M_dataplus._M_p != &functionDef.field_2) {
              operator_delete(functionDef._M_dataplus._M_p,
                              functionDef.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragment._M_dataplus._M_p != &fragment.field_2) {
              operator_delete(fragment._M_dataplus._M_p,fragment.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertex._M_dataplus._M_p != &vertex.field_2) {
              operator_delete(vertex._M_dataplus._M_p,vertex.field_2._M_allocated_capacity + 1);
            }
            local_750 = local_750 + 1;
            iVar9 = (((SparseTextureClampLookupResidencyTestCase *)
                     &local_740->super_SparseTexture2CommitmentTestCase)->
                    super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
                    super_SparseTextureCommitmentTestCase.mState.samples;
            GVar6 = depth;
          } while (local_750 < iVar9);
        }
        uVar10 = (int)local_730 + 1;
        local_730 = (ulong)uVar10;
      } while ((int)uVar10 < GVar6);
    }
    pFVar3 = local_748;
    (*local_748->bindFramebuffer)(0x8d40,0);
    GVar5 = (*pFVar3->getError)();
    glu::checkError(GVar5,"glBindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x3a3);
    gl4cts::Texture::Delete(pFVar3,&verifyTexture);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&f.allowedTargets._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.arguments._M_dataplus._M_p != &f.arguments.field_2) {
      operator_delete(f.arguments._M_dataplus._M_p,f.arguments.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.name._M_dataplus._M_p != &f.name.field_2) {
      operator_delete(f.name._M_dataplus._M_p,f.name.field_2._M_allocated_capacity + 1);
    }
    if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar14;
}

Assistant:

bool SparseTextureClampLookupColorTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
																	GLuint& texture, GLint level,
																	FunctionToken& funcToken)
{
	mLog << "Verify Lookup Color Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint  verifyTarget = GL_TEXTURE_2D;
	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, verifyTarget, verifyTexture, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D");

	gl.viewport(0, 0, width, height);

	for (GLint z = 0; z < depth; ++z)
	{
		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, 0, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string vertex   = stc_vertex_common;
			std::string fragment = stc_fragment_lookupColor;

			std::string functionDef = generateFunctionDef(f.name);

			// Adjust shader source to texture format
			TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

			// Change expected result as it has to be adjusted to different levels
			s.resultExpected = generateExpectedResult(s.returnType, level);

			replaceToken("<COORD_TYPE>", s.coordType.c_str(), vertex);

			replaceToken("<FUNCTION_DEF>", functionDef.c_str(), fragment);
			replaceToken("<FUNCTION>", f.name.c_str(), fragment);
			replaceToken("<ARGUMENTS>", f.arguments.c_str(), fragment);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), fragment);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), fragment);
			replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), fragment);
			replaceToken("<LOD>", s.lod.c_str(), fragment);
			replaceToken("<LOD_DEF>", s.lodDef.c_str(), fragment);
			replaceToken("<COORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<ICOORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<COORD_DEF>", s.coordDef.c_str(), fragment);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), fragment);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), fragment);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), fragment);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), fragment);
			replaceToken("<EPSILON>", s.epsilon.c_str(), fragment);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), fragment);
			replaceToken("<REFZ_DEF>", s.refZDef.c_str(), fragment);
			replaceToken("<POINT_COORD>", s.pointCoord.c_str(), fragment);
			replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), fragment);
			replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), fragment);
			replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), fragment);
			replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), fragment);
			replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), fragment);
			replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), fragment);
			replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), fragment);

			replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), fragment);
			replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), fragment);
			replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), fragment);

			ProgramSources sources = makeVtxFragSources(vertex.c_str(), fragment.c_str());

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

				// Pass input sampler/image to shader
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.uniform1i(1, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				draw(target, z, program);

				Texture::Bind(gl, verifyTexture, verifyTarget);
				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width;
						GLubyte* outDataRegion = out_data + x + y * width;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
			}
			else
			{
				mLog << "Shader compilation failed (lookup color) for target: " << target << ", format: " << format
					 << ", vertexInfoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
					 << ", fragmentInfoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
					 << ", programInfoLog: " << program.getProgramInfo().infoLog
					 << ", fragmentSource: " << fragment.c_str() << " - ";

				result = false;
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");

	Texture::Delete(gl, verifyTexture);

	return result;
}